

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::LocaleDisplayNamesImpl::adjustForUsageAndContext
          (LocaleDisplayNamesImpl *this,CapContextUsage usage,UnicodeString *result)

{
  short sVar1;
  UBool UVar2;
  int iVar3;
  UChar32 c;
  Mutex lock;
  Mutex local_20;
  
  sVar1 = (result->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (result->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  if (0 < iVar3) {
    c = UnicodeString::char32At(result,0);
    UVar2 = u_islower_63(c);
    if (((UVar2 != '\0') && (this->capitalizationBrkIter != (BreakIterator *)0x0)) &&
       ((this->capitalizationContext == UDISPCTX_CAPITALIZATION_FOR_BEGINNING_OF_SENTENCE ||
        (this->fCapitalization[usage] != '\0')))) {
      local_20.fMutex = (UMutex *)capitalizationBrkIterLock;
      umtx_lock_63((UMutex *)capitalizationBrkIterLock);
      UnicodeString::toTitle(result,this->capitalizationBrkIter,&this->locale,0x300);
      Mutex::~Mutex(&local_20);
    }
  }
  return result;
}

Assistant:

UnicodeString&
LocaleDisplayNamesImpl::adjustForUsageAndContext(CapContextUsage usage,
                                                UnicodeString& result) const {
#if !UCONFIG_NO_BREAK_ITERATION
    // check to see whether we need to titlecase result
    if ( result.length() > 0 && u_islower(result.char32At(0)) && capitalizationBrkIter!= NULL &&
          ( capitalizationContext==UDISPCTX_CAPITALIZATION_FOR_BEGINNING_OF_SENTENCE || fCapitalization[usage] ) ) {
        // note fCapitalization[usage] won't be set unless capitalizationContext is UI_LIST_OR_MENU or STANDALONE
        Mutex lock(&capitalizationBrkIterLock);
        result.toTitle(capitalizationBrkIter, locale, U_TITLECASE_NO_LOWERCASE | U_TITLECASE_NO_BREAK_ADJUSTMENT);
    }
#endif
    return result;
}